

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::FromSerialNumber(ON_ClippingPlaneDataList *this,uint sn)

{
  uint uVar1;
  ON_ClippingPlaneData *pOVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (sn != 0) {
    uVar1 = (this->m_list).m_count;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pOVar2 = (this->m_list).m_a[uVar4];
      if ((pOVar2 != (ON_ClippingPlaneData *)0x0) && (pOVar2->m_sn == sn)) {
        return pOVar2;
      }
    }
  }
  return (ON_ClippingPlaneData *)0x0;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::FromSerialNumber(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  // TODO: use binary search
  int count = m_list.Count();
  for (int i=0; i<count; i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data && data->m_sn == sn)
      return data;
  }
  return nullptr;
}